

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

string * __thiscall pbrt::SubsurfaceMaterial::ToString_abi_cxx11_(SubsurfaceMaterial *this)

{
  SpectrumTextureHandle *unaff_RBX;
  string *in_RDI;
  SpectrumTextureHandle *unaff_R14;
  float *unaff_R15;
  FloatTextureHandle *unaff_retaddr;
  char *in_stack_00000008;
  SpectrumTextureHandle *in_stack_00000048;
  FloatTextureHandle *in_stack_00000050;
  FloatTextureHandle *in_stack_00000058;
  float *in_stack_00000060;
  bool *in_stack_00000068;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,float_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,float_const&,bool_const&>
            (in_stack_00000008,unaff_retaddr,unaff_R15,unaff_R14,unaff_RBX,
             (SpectrumTextureHandle *)this,in_stack_00000048,in_stack_00000050,in_stack_00000058,
             in_stack_00000060,in_stack_00000068);
  return in_RDI;
}

Assistant:

std::string SubsurfaceMaterial::ToString() const {
    return StringPrintf("[ SubsurfaceMaterial displacment: %s scale: %f "
                        "sigma_a: %s sigma_s: %s "
                        "reflectance: %s mfp: %s uRoughness: %s vRoughness: %s "
                        "eta: %f remapRoughness: %s ]",
                        displacement, scale, sigma_a, sigma_s, reflectance, mfp,
                        uRoughness, vRoughness, eta, remapRoughness);
}